

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O2

int x25519_get_priv_raw(EVP_PKEY *pkey,uint8_t *out,size_t *out_len)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int reason;
  int iVar5;
  int line;
  
  pvVar1 = pkey->pkey;
  if (*(char *)((long)pvVar1 + 0x40) == '\0') {
    line = 0x4c;
    reason = 0x82;
LAB_003f0866:
    iVar5 = 0;
    ERR_put_error(6,0,reason,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                  ,line);
  }
  else {
    if (out != (uint8_t *)0x0) {
      if (*out_len < 0x20) {
        reason = 100;
        line = 0x56;
        goto LAB_003f0866;
      }
      uVar2 = *(undefined8 *)((long)pvVar1 + 0x20);
      uVar3 = *(undefined8 *)((long)pvVar1 + 0x28);
      uVar4 = *(undefined8 *)((long)pvVar1 + 0x38);
      *(undefined8 *)(out + 0x10) = *(undefined8 *)((long)pvVar1 + 0x30);
      *(undefined8 *)(out + 0x18) = uVar4;
      *(undefined8 *)out = uVar2;
      *(undefined8 *)(out + 8) = uVar3;
    }
    *out_len = 0x20;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int x25519_get_priv_raw(const EVP_PKEY *pkey, uint8_t *out,
                               size_t *out_len) {
  const X25519_KEY *key = reinterpret_cast<X25519_KEY *>(pkey->pkey);
  if (!key->has_private) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NOT_A_PRIVATE_KEY);
    return 0;
  }

  if (out == NULL) {
    *out_len = 32;
    return 1;
  }

  if (*out_len < 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  OPENSSL_memcpy(out, key->priv, 32);
  *out_len = 32;
  return 1;
}